

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O2

bool __thiscall
msgpack::v2::detail::create_object_visitor::visit_bin
          (create_object_visitor *this,char *v,uint32_t size)

{
  object *poVar1;
  bool bVar2;
  object *__dest;
  bin_size_overflow *this_00;
  ulong size_00;
  
  size_00 = (ulong)size;
  if ((this->m_limit).bin_ < size_00) {
    this_00 = (bin_size_overflow *)__cxa_allocate_exception(0x10);
    v1::bin_size_overflow::bin_size_overflow(this_00,"bin size overflow");
    __cxa_throw(this_00,&v1::bin_size_overflow::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = (this->m_stack).
           super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>._M_impl
           .super__Vector_impl_data._M_finish[-1];
  (poVar1->super_object).type = BIN;
  if ((this->m_func != (unpack_reference_func)0x0) &&
     (bVar2 = (*this->m_func)(BIN,size_00,this->m_user_data), bVar2)) {
    (poVar1->super_object).via.str.ptr = v;
    (poVar1->super_object).via.array.size = size;
    this->m_referenced = true;
    return true;
  }
  if (v == (char *)0x0) {
    (poVar1->super_object).via.array.ptr = (object *)0x0;
    (poVar1->super_object).via.array.size = 0;
  }
  else {
    __dest = (object *)v1::zone::allocate_align(this->m_zone,size_00,1);
    memcpy(__dest,v,size_00);
    (poVar1->super_object).via.array.ptr = __dest;
    (poVar1->super_object).via.array.size = size;
  }
  return true;
}

Assistant:

bool visit_bin(const char* v, uint32_t size) {
        MSGPACK_ASSERT(v || size == 0);
        if (size > m_limit.bin()) throw msgpack::bin_size_overflow("bin size overflow");
        msgpack::object* obj = m_stack.back();
        obj->type = msgpack::type::BIN;
        if (m_func && m_func(obj->type, size, m_user_data)) {
            obj->via.bin.ptr = v;
            obj->via.bin.size = size;
            set_referenced(true);
        }
        else {
            if (v) {
                char* tmp = static_cast<char*>(zone().allocate_align(size, MSGPACK_ZONE_ALIGNOF(char)));
                std::memcpy(tmp, v, size);
                obj->via.bin.ptr = tmp;
                obj->via.bin.size = size;
            }
            else {
                obj->via.bin.ptr = MSGPACK_NULLPTR;
                obj->via.bin.size = 0;
            }
        }
        return true;
    }